

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_generator.cc
# Opt level: O0

void __thiscall google::protobuf::compiler::cpp::CppGenerator::CppGenerator(CppGenerator *this)

{
  CppGenerator *this_local;
  
  CodeGenerator::CodeGenerator(&this->super_CodeGenerator);
  (this->super_CodeGenerator)._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_008e4d48;
  this->opensource_runtime_ = true;
  std::__cxx11::string::string((string *)&this->runtime_include_base_);
  return;
}

Assistant:

CppGenerator::CppGenerator() {}